

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase197::run(TestCase197 *this)

{
  undefined8 uVar1;
  Disposer *pDVar2;
  anon_enum_32 *in_R9;
  WaitScope waitScope;
  pthread_t mainThread;
  Thread thread;
  EventLoop loop;
  siginfo_t info;
  UnixEventPort port;
  Promise<siginfo_t> *in_stack_fffffffffffffdf8;
  Promise<siginfo_t> *this_00;
  undefined1 local_1f8 [24];
  Disposer *local_1e0;
  EventLoop *local_1d8;
  undefined4 local_1d0;
  SignalPromiseAdapter **local_1c8;
  Thread local_1c0;
  EventLoop local_1a8;
  Promise<siginfo_t> local_170 [8];
  UnixEventPort local_f0;
  
  captureSignals();
  UnixEventPort::UnixEventPort(&local_f0);
  EventLoop::EventLoop(&local_1a8,&local_f0.super_EventPort);
  local_1d0 = 0xffffffff;
  local_1d8 = &local_1a8;
  EventLoop::enterScope(&local_1a8);
  local_1c8 = (SignalPromiseAdapter **)pthread_self();
  local_1e0 = (Disposer *)operator_new(0x10);
  local_1e0->_vptr_Disposer = (_func_int **)&PTR_operator___00454930;
  local_1e0[1]._vptr_Disposer = (_func_int **)&local_1c8;
  local_1f8._16_8_ =
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase197::run()::$_0>>
        ::instance;
  Thread::Thread(&local_1c0,(Function<void_()> *)(local_1f8 + 0x10));
  pDVar2 = local_1e0;
  if (local_1e0 != (Disposer *)0x0) {
    local_1e0 = (Disposer *)0x0;
    (*(code *)**(undefined8 **)local_1f8._16_8_)
              (local_1f8._16_8_,pDVar2->_vptr_Disposer[-2] + (long)&pDVar2->_vptr_Disposer);
  }
  UnixEventPort::onSignal((UnixEventPort *)local_1f8,(int)&local_f0);
  this_00 = local_170;
  Promise<siginfo_t>::wait(this_00,local_1f8);
  uVar1 = local_1f8._8_8_;
  if ((_func_int **)local_1f8._8_8_ != (_func_int **)0x0) {
    local_1f8._8_8_ = (_func_int **)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_1f8._4_4_,local_1f8._0_4_))
              ((undefined8 *)CONCAT44(local_1f8._4_4_,local_1f8._0_4_),
               uVar1 + *(long *)(*(_func_int **)uVar1 + -0x10));
  }
  if (((int)local_170[0].super_PromiseBase.node.disposer != 0x17) && (_::Debug::minSeverity < 3)) {
    in_R9 = (anon_enum_32 *)local_1f8;
    local_1f8._0_4_ = _SC_AIO_LISTIO_MAX;
    _::Debug::log<char_const(&)[41],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0xd3,ERROR,"\"failed: expected \" \"(23) == (info.si_signo)\", 23, info.si_signo",
               (char (*) [41])"failed: expected (23) == (info.si_signo)",in_R9,(int *)this_00);
    in_stack_fffffffffffffdf8 = this_00;
  }
  if (((int)local_170[0].super_PromiseBase.node.ptr != -6) && (_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = SI_TKILL;
    _::Debug::log<char_const(&)[46],__0,int&>
              ((char *)0xd5,0x37700c,0x377057,local_1f8,
               (char (*) [46])&local_170[0].super_PromiseBase.node.ptr,in_R9,
               (int *)in_stack_fffffffffffffdf8);
  }
  Thread::~Thread(&local_1c0);
  EventLoop::leaveScope(local_1d8);
  EventLoop::~EventLoop(&local_1a8);
  UnixEventPort::~UnixEventPort(&local_f0);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsAsync) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  // Arrange for a signal to be sent from another thread.
  pthread_t mainThread = pthread_self();
  Thread thread([&]() {
    delay();
    pthread_kill(mainThread, SIGURG);
  });

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
#if __linux__
  EXPECT_SI_CODE(SI_TKILL, info.si_code);
#endif
}